

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceNextGenBase.hpp
# Opt level: O1

ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> * __thiscall
Diligent::
RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
::GetReleaseQueue(RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                  *this,SoftwareQueueIndex QueueInd)

{
  char (*in_RCX) [27];
  string msg;
  string local_38;
  
  if (this->m_CmdQueueCount <= (ulong)QueueInd.m_Value) {
    FormatString<char[26],char[27]>
              (&local_38,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x80c319,in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GetReleaseQueue",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
               ,0xf0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return &this->m_CommandQueues[QueueInd.m_Value].ReleaseQueue;
}

Assistant:

ResourceReleaseQueue<DynamicStaleResourceWrapper>& GetReleaseQueue(SoftwareQueueIndex QueueInd)
    {
        VERIFY_EXPR(QueueInd < m_CmdQueueCount);
        return m_CommandQueues[QueueInd].ReleaseQueue;
    }